

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O3

void __thiscall
QOpenGLTextureBlitterPrivate::blit
          (QOpenGLTextureBlitterPrivate *this,GLuint texture,QMatrix4x4 *targetTransform,
          Origin origin)

{
  GLenum GVar1;
  GLenum GVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  float *pfVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar15;
  QMatrix3x3 textureTransform;
  QMatrix3x3 sourceTransform;
  QMatrix3x3 local_88;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined4 local_48;
  float fStack_44;
  undefined8 uStack_40;
  float local_38;
  long local_30;
  long lVar14;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GVar1 = this->currentTarget;
  QOpenGLContext::currentContext();
  puVar4 = (undefined8 *)QOpenGLContext::functions();
  (**(code **)*puVar4)(GVar1,texture);
  bVar3 = prepareProgram(this,targetTransform);
  if (bVar3) {
    GVar2 = this->currentTarget;
    if (GVar2 == 0xde1) {
      iVar11 = 0;
    }
    else if (GVar2 == 0x84f5) {
      iVar11 = 2;
    }
    else if (GVar2 == 0x8d65) {
      iVar11 = 1;
    }
    else {
      local_58._0_4_ = 2.8026e-45;
      stack0xffffffffffffffac = (undefined1  [16])0x0;
      fStack_44 = 0.0;
      uStack_40 = "default";
      iVar11 = 0;
      QMessageLogger::warning(local_58,"Unsupported texture target 0x%x");
    }
    puVar4 = (undefined8 *)((long)&this->programs[0].glProgram.d + (ulong)(uint)(iVar11 * 0x30));
    iVar11 = *(int *)((long)&this->programs[0].textureMatrixUniformState +
                     (ulong)(uint)(iVar11 * 0x30));
    if (origin == OriginTopLeft) {
      if (iVar11 != 2) {
        puVar5 = local_58 + 4;
        fStack_44 = -NAN;
        uStack_40._0_4_ = -NAN;
        uStack_40._4_4_ = 0.0;
        local_58._0_4_ = -NAN;
        uStack_4c = 0xffffffff;
        local_58._4_8_ = 0xffffffffffffffff;
        local_48 = 0xffffffff;
        local_38 = -NAN;
        lVar8 = 0;
        lVar9 = 0;
        do {
          lVar10 = 0;
          auVar12 = _DAT_00178220;
          do {
            bVar3 = SUB164(auVar12 ^ _DAT_00178230,4) == -0x80000000 &&
                    SUB164(auVar12 ^ _DAT_00178230,0) < -0x7ffffffd;
            if (bVar3) {
              uVar15 = 0x3f800000;
              if (lVar8 != lVar10) {
                uVar15 = 0;
              }
              *(undefined4 *)(puVar5 + lVar10 + -4) = uVar15;
            }
            if (bVar3) {
              uVar15 = 0x3f800000;
              if (lVar8 + -4 != lVar10) {
                uVar15 = 0;
              }
              *(undefined4 *)(puVar5 + lVar10) = uVar15;
            }
            lVar14 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 2;
            auVar12._8_8_ = lVar14 + 2;
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x10);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 4;
          puVar5 = puVar5 + 0xc;
        } while (lVar9 != 3);
        local_48 = 0xbf800000;
        uStack_40 = (char *)CONCAT44(0x3f800000,(float)uStack_40);
        local_88.m[1][1] = -NAN;
        local_88.m[1][2] = -NAN;
        local_88.m[2][0] = -NAN;
        local_88.m[2][1] = -NAN;
        local_88.m[0][0] = -NAN;
        local_88.m[0][1] = -NAN;
        local_88.m[0][2] = -NAN;
        local_88.m[1][0] = -NAN;
        local_88.m[2][2] = -NAN;
        toTextureCoordinates(&local_88,this,(QMatrix3x3 *)local_58);
        QOpenGLShaderProgram::setUniformValue
                  ((QOpenGLShaderProgram *)*puVar4,*(int *)((long)puVar4 + 0x14),&local_88);
        *(undefined4 *)(puVar4 + 5) = 2;
      }
    }
    else if (iVar11 != 1) {
      fStack_44 = -NAN;
      uStack_40 = (char *)0xffffffffffffffff;
      local_58._0_4_ = -NAN;
      uStack_4c = 0xffffffff;
      local_58._4_8_ = 0xffffffffffffffff;
      local_48 = 0xffffffff;
      local_38 = -NAN;
      pfVar6 = local_88.m[0] + 1;
      lVar8 = 0;
      lVar9 = 0;
      do {
        lVar10 = 0;
        auVar13 = _DAT_00178220;
        do {
          bVar3 = SUB164(auVar13 ^ _DAT_00178230,4) == -0x80000000 &&
                  SUB164(auVar13 ^ _DAT_00178230,0) < -0x7ffffffd;
          if (bVar3) {
            uVar15 = 0x3f800000;
            if (lVar8 != lVar10) {
              uVar15 = 0;
            }
            *(undefined4 *)((long)pfVar6 + lVar10 + -4) = uVar15;
          }
          if (bVar3) {
            uVar15 = 0x3f800000;
            if (lVar8 + -4 != lVar10) {
              uVar15 = 0;
            }
            *(undefined4 *)((long)pfVar6 + lVar10) = uVar15;
          }
          lVar14 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar14 + 2;
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x10);
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 4;
        pfVar6 = pfVar6 + 3;
      } while (lVar9 != 3);
      toTextureCoordinates((QMatrix3x3 *)local_58,this,&local_88);
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)*puVar4,*(int *)((long)puVar4 + 0x14),
                 (QMatrix3x3 *)local_58);
      *(undefined4 *)(puVar4 + 5) = 1;
    }
    QOpenGLContext::currentContext();
    plVar7 = (long *)QOpenGLContext::functions();
    (**(code **)(*plVar7 + 0x78))(4,0,6);
  }
  QOpenGLContext::currentContext();
  puVar4 = (undefined8 *)QOpenGLContext::functions();
  (**(code **)*puVar4)(GVar1,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureBlitterPrivate::blit(GLuint texture,
                                        const QMatrix4x4 &targetTransform,
                                        QOpenGLTextureBlitter::Origin origin)
{
    QBlitterTextureBinder binder(currentTarget, texture);
    if (!prepareProgram(targetTransform))
        return;

    Program *program = &programs[targetToProgramIndex(currentTarget)];

    if (origin == QOpenGLTextureBlitter::OriginTopLeft) {
        if (program->textureMatrixUniformState != IdentityFlipped) {
            QMatrix3x3 sourceTransform;
            sourceTransform(1,1) = -1;
            sourceTransform(1,2) = 1;
            const QMatrix3x3 textureTransform = toTextureCoordinates(sourceTransform);
            program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
            program->textureMatrixUniformState = IdentityFlipped;
        }
    } else if (program->textureMatrixUniformState != Identity) {
        const QMatrix3x3 textureTransform = toTextureCoordinates(QMatrix3x3());
        program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
        program->textureMatrixUniformState = Identity;
    }

    QOpenGLContext::currentContext()->functions()->glDrawArrays(GL_TRIANGLES, 0, 6);
}